

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::StaticAssertTask::StaticAssertTask(StaticAssertTask *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,StaticAssert,Task);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005a8a18;
  return;
}

Assistant:

StaticAssertTask() : SystemSubroutine(KnownSystemName::StaticAssert, SubroutineKind::Task) {}